

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)>::
Matches(TypedExpectation<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)> *this,
       ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
                    (&this->matchers_,args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>::
            Matches(&(this->extra_matcher_).
                     super_MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>
                    ,args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }